

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O3

void __thiscall
Fl_Input_::handle_mouse(Fl_Input_ *this,int X,int Y,int param_3,int param_4,int drag)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  undefined4 in_register_0000000c;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  double dVar16;
  char buf [1024];
  char **local_448;
  double local_440;
  char local_438 [1032];
  
  was_up_down = 0;
  if (this->size_ != 0) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
              (fl_graphics_driver,(ulong)(uint)this->textfont_,(ulong)(uint)this->textsize_,
               CONCAT44(in_register_0000000c,param_3));
    if (((this->super_Fl_Widget).type_ & 7) == 4) {
      iVar8 = Fl::e_y - Y;
      iVar6 = this->yscroll_;
      iVar3 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
      iVar3 = (iVar8 + iVar6) / iVar3;
      pcVar14 = this->value_;
      pcVar7 = expand(this,pcVar14,local_438);
      if ((0 < iVar3) && (pcVar7 < this->value_ + this->size_)) {
        iVar3 = iVar3 + 1;
        do {
          pcVar14 = pcVar7 + 1;
          pcVar7 = expand(this,pcVar14,local_438);
          iVar3 = iVar3 + -1;
          if (iVar3 < 2) break;
        } while (pcVar7 < this->value_ + this->size_);
      }
    }
    else {
      pcVar14 = this->value_;
      pcVar7 = expand(this,pcVar14,local_438);
    }
    local_448 = &this->value_;
    local_440 = (double)((Fl::e_x - X) + this->xscroll_);
    pcVar13 = pcVar14;
    if (pcVar14 < pcVar7) {
      pcVar12 = pcVar7;
      do {
        uVar4 = fl_utf8len(*pcVar13);
        if ((int)uVar4 < 2) {
          uVar4 = 1;
        }
        iVar6 = this->xscroll_;
        dVar16 = expandpos(this,pcVar14,pcVar13 + uVar4,local_438,(int *)0x0);
        dVar16 = dVar16 + (double)(X - iVar6);
        pcVar2 = pcVar13;
        if (dVar16 <= (double)Fl::e_x) {
          local_440 = (double)Fl::e_x - dVar16;
          pcVar13 = pcVar13 + uVar4;
          pcVar2 = pcVar12;
        }
        pcVar12 = pcVar2;
      } while (pcVar13 < pcVar12);
    }
    if ((pcVar13 < pcVar7) && (uVar4 = fl_utf8len(*pcVar13), 0 < (int)uVar4)) {
      iVar6 = this->xscroll_;
      dVar16 = expandpos(this,pcVar14,pcVar13 + uVar4,local_438,(int *)0x0);
      if ((dVar16 + (double)(X - iVar6)) - (double)Fl::e_x < local_440) {
        pcVar13 = pcVar13 + uVar4;
      }
    }
    pcVar14 = this->value_;
    uVar15 = (long)pcVar13 - (long)pcVar14;
    uVar4 = (uint)uVar15;
    uVar10 = uVar15 & 0xffffffff;
    if (drag != 0) {
      uVar10 = (ulong)(uint)this->mark_;
    }
    uVar5 = (uint)uVar10;
    if (Fl::e_clicks != 0) {
      if ((int)uVar4 < (int)uVar5) {
        if (Fl::e_clicks < 2) {
          if (((this->super_Fl_Widget).type_ & 7) == 5) {
            uVar4 = 0;
            uVar5 = this->size_;
          }
          else {
            if (0 < (int)uVar4) {
              uVar15 = (ulong)(uVar4 & 0x7fffffff);
              do {
                iVar6 = isspace((int)pcVar14[uVar15 - 1]);
                if (iVar6 != 0) goto LAB_001829e8;
                bVar1 = 1 < (long)uVar15;
                uVar15 = uVar15 - 1;
              } while (bVar1);
              uVar15 = 0;
            }
LAB_001829e8:
            uVar11 = this->size_;
            uVar4 = (uint)uVar15;
            if ((int)uVar5 < (int)uVar11) {
              pcVar14 = pcVar14 + (int)uVar5;
              do {
                iVar6 = isspace((int)*pcVar14);
                uVar5 = (uint)uVar10;
                if (iVar6 != 0) break;
                uVar9 = (uint)uVar10 + 1;
                uVar10 = (ulong)uVar9;
                pcVar14 = pcVar14 + 1;
                uVar5 = uVar11;
              } while (uVar11 != uVar9);
            }
          }
        }
        else {
          uVar4 = line_start(this,uVar4);
          uVar5 = line_end(this,uVar5);
        }
      }
      else {
        uVar11 = uVar4;
        if (uVar5 == uVar4) {
          if ((int)uVar4 < this->size_) {
            uVar10 = uVar15;
            uVar11 = uVar4 + 1;
          }
          else {
            uVar10 = (ulong)(uVar4 - 1);
          }
        }
        uVar9 = (uint)uVar10;
        if (Fl::e_clicks < 2) {
          uVar4 = this->size_;
          uVar5 = 0;
          if (((this->super_Fl_Widget).type_ & 7) != 5) {
            uVar5 = uVar11;
            if ((int)uVar11 < (int)uVar4) {
              pcVar7 = pcVar14 + (int)uVar11;
              do {
                iVar6 = isspace((int)*pcVar7);
                uVar5 = uVar11;
                if (iVar6 != 0) break;
                uVar11 = uVar11 + 1;
                pcVar7 = pcVar7 + 1;
                uVar5 = uVar4;
              } while (uVar4 != uVar11);
            }
            uVar4 = uVar5;
            uVar5 = uVar9;
            if (0 < (int)uVar9) {
              uVar15 = uVar10 & 0xffffffff;
              do {
                iVar6 = isspace((int)pcVar14[uVar15 - 1]);
                if (iVar6 != 0) {
                  uVar5 = (uint)uVar15;
                  break;
                }
                bVar1 = 1 < (long)uVar15;
                uVar15 = uVar15 - 1;
                uVar5 = 0;
              } while (bVar1);
            }
          }
        }
        else {
          uVar4 = line_end(this,uVar11);
          uVar5 = line_start(this,uVar9);
        }
      }
      if (drag == 0) {
        iVar6 = this->position_;
        iVar3 = this->mark_;
        iVar8 = iVar6;
        if (iVar6 < iVar3) {
          iVar8 = iVar3;
          iVar3 = iVar6;
        }
        if ((iVar3 <= (int)uVar5) && ((int)uVar4 <= iVar8)) {
          Fl::e_clicks = 0;
          uVar4 = (int)pcVar13 - *(int *)local_448;
          uVar5 = uVar4;
        }
      }
    }
    position(this,uVar4,uVar5);
  }
  return;
}

Assistant:

void Fl_Input_::handle_mouse(int X, int Y, int /*W*/, int /*H*/, int drag) {
  was_up_down = 0;
  if (!size()) return;
  setfont();

  const char *p, *e;
  char buf[MAXBUF];

  int theline = (input_type()==FL_MULTILINE_INPUT) ?
    (Fl::event_y()-Y+yscroll_)/fl_height() : 0;

  int newpos = 0;
  for (p=value();; ) {
    e = expand(p, buf);
    theline--; if (theline < 0) break;
    if (e >= value_+size_) break;
    p = e+1;
  }
  const char *l, *r, *t; double f0 = Fl::event_x()-X+xscroll_;
  for (l = p, r = e; l<r; ) {
    double f;
    int cw = fl_utf8len((char)l[0]);
    if (cw < 1) cw = 1;
    t = l+cw;
    f = X-xscroll_+expandpos(p, t, buf, 0);
    if (f <= Fl::event_x()) {l = t; f0 = Fl::event_x()-f;}
    else r = t-cw;
  }
  if (l < e) { // see if closer to character on right:
    double f1;
    int cw = fl_utf8len((char)l[0]);
    if (cw > 0) {
      f1 = X-xscroll_+expandpos(p, l + cw, buf, 0) - Fl::event_x();
      if (f1 < f0) l = l+cw;
    }
  }
  newpos = (int) (l-value());

  int newmark = drag ? mark() : newpos;
  if (Fl::event_clicks()) {
    if (newpos >= newmark) {
      if (newpos == newmark) {
	if (newpos < size()) newpos++;
	else newmark--;
      }
      if (Fl::event_clicks() > 1) {
	newpos = line_end(newpos);
	newmark = line_start(newmark);
      } else {
	newpos = strict_word_end(value(), size(), newpos, input_type());
	newmark = strict_word_start(value(), newmark, input_type());
      }
    } else {
      if (Fl::event_clicks() > 1) {
	newpos = line_start(newpos);
	newmark = line_end(newmark);
      } else {
	newpos = strict_word_start(value(), newpos, input_type());
	newmark = strict_word_end(value(), size(), newmark, input_type());
      }
    }
    // if the multiple click does not increase the selection, revert
    // to single-click behavior:
    if (!drag && (mark() > position() ?
                  (newmark >= position() && newpos <= mark()) :
                  (newmark >= mark() && newpos <= position()))) {
      Fl::event_clicks(0);
      newmark = newpos = (int) (l-value());
    }
  }
  position(newpos, newmark);
}